

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> * __thiscall
QPDF::getAllObjects(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                    *__return_storage_ptr__,QPDF *this)

{
  bool bVar1;
  pointer pMVar2;
  value_type local_50;
  reference local_40;
  pair<const_QPDFObjGen,_QPDF::ObjCache> *iter;
  iterator __end1;
  iterator __begin1;
  map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
  *__range1;
  QPDF *this_local;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *result;
  
  fixDanglingReferences(this,false);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(__return_storage_ptr__);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  __end1 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::begin(&pMVar2->obj_cache);
  iter = (pair<const_QPDFObjGen,_QPDF::ObjCache> *)
         std::
         map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
         ::end(&pMVar2->obj_cache);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&iter), bVar1) {
    local_40 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>::operator*
                         (&__end1);
    newIndirect((QPDF *)&local_50,(QPDFObjGen)this,(shared_ptr<QPDFObject> *)local_40->first);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              (__return_storage_ptr__,&local_50);
    QPDFObjectHandle::~QPDFObjectHandle(&local_50);
    std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFObjectHandle>
QPDF::getAllObjects()
{
    // After fixDanglingReferences is called, all objects are in the object cache.
    fixDanglingReferences();
    std::vector<QPDFObjectHandle> result;
    for (auto const& iter: m->obj_cache) {
        result.push_back(newIndirect(iter.first, iter.second.object));
    }
    return result;
}